

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

Integer pnga_sprs_array_duplicate(Integer s_a)

{
  long lVar1;
  _sparse_array *p_Var2;
  _sparse_array *p_Var3;
  _sparse_array *p_Var4;
  long end;
  Integer IVar5;
  logical lVar6;
  Integer *pIVar7;
  long lVar8;
  long lVar9;
  long begin;
  char p_trans [2];
  Integer lo;
  Integer local_98;
  long local_90;
  long local_88;
  Integer local_80;
  Integer local_78;
  Integer hi;
  Integer thi [3];
  Integer tlo [3];
  
  lVar8 = s_a + 1000;
  IVar5 = SPA[s_a + 1000].grp;
  local_80 = pnga_pgroup_nodeid(IVar5);
  pnga_pgroup_nnodes(IVar5);
  begin = (long)_ga_sync_begin;
  lVar9 = (long)_ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (begin != 0) {
    pnga_pgroup_sync(IVar5);
  }
  local_98 = IVar5;
  pnga_mask_sync(begin,lVar9);
  IVar5 = pnga_sprs_array_create
                    (SPA[lVar8].idim,SPA[lVar8].jdim,SPA[lVar8].type,SPA[lVar8].idx_size);
  lVar1 = IVar5 + 1000;
  pnga_mask_sync(begin,lVar9);
  local_78 = IVar5;
  lVar6 = pnga_duplicate(SPA[lVar8].g_data,&SPA[IVar5 + 1000].g_data,"sparse_data_copy");
  if (lVar6 == 0) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_data",0);
  }
  pnga_mask_sync(begin,lVar9);
  lVar6 = pnga_duplicate(SPA[lVar8].g_i,&SPA[lVar1].g_i,"sparse_i_index_copy");
  if (lVar6 == 0) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_i",0);
  }
  pnga_mask_sync(begin,lVar9);
  lVar6 = pnga_duplicate(SPA[lVar8].g_j,&SPA[lVar1].g_j,"sparse_j_index_copy");
  if (lVar6 == 0) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_j",0);
  }
  pnga_mask_sync(begin,lVar9);
  lVar6 = pnga_duplicate(SPA[lVar8].g_blk,&SPA[lVar1].g_blk,"sparse_g_block_copy");
  local_88 = lVar9;
  if (lVar6 == 0) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_blk",0);
  }
  IVar5 = local_80;
  p_trans[0] = 'N';
  p_trans[1] = '\0';
  pnga_distribution(SPA[lVar1].g_i,local_80,&lo,&hi);
  end = local_88;
  local_90 = begin;
  pnga_mask_sync(begin,local_88);
  pnga_copy_patch(p_trans,SPA[lVar8].g_i,&lo,&hi,SPA[lVar1].g_i,&lo,&hi);
  pnga_distribution(SPA[lVar1].g_j,IVar5,&lo,&hi);
  lVar9 = local_90;
  pnga_mask_sync(local_90,end);
  pnga_copy_patch(p_trans,SPA[lVar8].g_j,&lo,&hi,SPA[lVar1].g_j,&lo,&hi);
  pnga_distribution(SPA[lVar1].g_data,IVar5,&lo,&hi);
  pnga_mask_sync(lVar9,end);
  pnga_copy_patch(p_trans,SPA[lVar8].g_data,&lo,&hi,SPA[lVar1].g_data,&lo,&hi);
  pnga_distribution(SPA[lVar1].g_blk,local_80,tlo,thi);
  pnga_mask_sync(local_90,end);
  pnga_copy_patch(p_trans,SPA[lVar8].g_blk,tlo,thi,SPA[lVar1].g_blk,tlo,thi);
  p_Var2 = SPA;
  SPA[lVar1].ihi = SPA[lVar8].ihi;
  p_Var2[lVar1].nblocks = p_Var2[lVar8].nblocks;
  IVar5 = (&p_Var2[lVar8].nval)[1];
  p_Var2[lVar1].nval = p_Var2[lVar8].nval;
  (&p_Var2[lVar1].nval)[1] = IVar5;
  p_Var2[lVar1].max_nnz = p_Var2[lVar8].max_nnz;
  p_Var2[lVar1].ready = p_Var2[lVar8].ready;
  IVar5 = (&p_Var2[lVar8].grp)[1];
  p_Var2[lVar1].grp = p_Var2[lVar8].grp;
  (&p_Var2[lVar1].grp)[1] = IVar5;
  p_Var2[lVar1].val = (void *)0x0;
  SPA[lVar1].idx = (Integer *)0x0;
  SPA[lVar1].jdx = (Integer *)0x0;
  p_Var2 = SPA;
  if (0 < SPA[lVar1].nblocks) {
    pIVar7 = (Integer *)malloc(SPA[lVar1].nblocks << 3);
    p_Var2[lVar1].blkidx = pIVar7;
    p_Var2 = SPA;
    pIVar7 = (Integer *)malloc(SPA[lVar1].nblocks << 3);
    p_Var2[lVar1].blksize = pIVar7;
    p_Var2 = SPA;
    pIVar7 = (Integer *)malloc(SPA[lVar1].nblocks << 3);
    p_Var2[lVar1].offset = pIVar7;
  }
  p_Var4 = SPA;
  p_Var2 = SPA + lVar8;
  p_Var3 = SPA + lVar1;
  for (lVar9 = 0; lVar9 < p_Var4[lVar1].nblocks; lVar9 = lVar9 + 1) {
    p_Var4[lVar1].blkidx[lVar9] = p_Var2->blkidx[lVar9];
    p_Var3->blksize[lVar9] = p_Var4[lVar8].blksize[lVar9];
    p_Var4[lVar1].offset[lVar9] = p_Var4[lVar8].offset[lVar9];
  }
  if ((int)local_88 != 0) {
    pnga_pgroup_sync(local_98);
  }
  return local_78;
}

Assistant:

Integer pnga_sprs_array_duplicate(Integer s_a)
{
  Integer hdl = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer new_hdl;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer s_dup;
  Integer lo, hi;
  Integer i;
  char p_trans[2];

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* create new array with same properties as old array */
  pnga_mask_sync(local_sync_begin,local_sync_end);
  s_dup = pnga_sprs_array_create(SPA[hdl].idim,SPA[hdl].jdim,SPA[hdl].type,
      SPA[hdl].idx_size);
  /* find handle for new array and duplicate internal GAs */
  new_hdl = GA_OFFSET + s_dup;
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_duplicate(SPA[hdl].g_data,&SPA[new_hdl].g_data,"sparse_data_copy")) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_data",0);
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_duplicate(SPA[hdl].g_i,&SPA[new_hdl].g_i,"sparse_i_index_copy")) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_i",0);
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_duplicate(SPA[hdl].g_j,&SPA[new_hdl].g_j,"sparse_j_index_copy")) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_j",0);
  }
  pnga_mask_sync(local_sync_begin,local_sync_end);
  if (!pnga_duplicate(SPA[hdl].g_blk,&SPA[new_hdl].g_blk,"sparse_g_block_copy")) {
    pnga_error("(pnga_sprs_array_duplicate) Could not duplicate g_blk",0);
  }

  /* Copy data from old array to new array */
  p_trans[0]='N';
  p_trans[1]='\0';
  pnga_distribution(SPA[new_hdl].g_i,me,&lo,&hi);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_copy_patch(p_trans,SPA[hdl].g_i,&lo,&hi,SPA[new_hdl].g_i,&lo,&hi);
  pnga_distribution(SPA[new_hdl].g_j,me,&lo,&hi);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_copy_patch(p_trans,SPA[hdl].g_j,&lo,&hi,SPA[new_hdl].g_j,&lo,&hi);
  pnga_distribution(SPA[new_hdl].g_data,me,&lo,&hi);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_copy_patch(p_trans,SPA[hdl].g_data,&lo,&hi,SPA[new_hdl].g_data,&lo,&hi);
  {
    Integer tlo[3],thi[3];
    pnga_distribution(SPA[new_hdl].g_blk,me,tlo,thi);
    pnga_mask_sync(local_sync_begin,local_sync_end);
    pnga_copy_patch(p_trans,SPA[hdl].g_blk,tlo,thi,SPA[new_hdl].g_blk,tlo,thi);
  }
  /* copy remaining data structures */
  SPA[new_hdl].ilo = SPA[hdl].ilo;
  SPA[new_hdl].ihi = SPA[hdl].ihi;
  SPA[new_hdl].nblocks = SPA[hdl].nblocks;
  SPA[new_hdl].nval = SPA[hdl].nval;
  SPA[new_hdl].maxval = SPA[hdl].maxval;
  SPA[new_hdl].max_nnz = SPA[hdl].max_nnz;
  SPA[new_hdl].ready = SPA[hdl].ready;
  SPA[new_hdl].grp = SPA[hdl].grp;
  SPA[new_hdl].val = NULL;
  SPA[new_hdl].idx = NULL;
  SPA[new_hdl].jdx = NULL;
  if (SPA[new_hdl].nblocks > 0) {
    SPA[new_hdl].blkidx
      = (Integer*)malloc(SPA[new_hdl].nblocks*sizeof(Integer));
    SPA[new_hdl].blksize
      = (Integer*)malloc(SPA[new_hdl].nblocks*sizeof(Integer));
    SPA[new_hdl].offset
      = (Integer*)malloc(SPA[new_hdl].nblocks*sizeof(Integer));
  }
  for (i=0; i<SPA[new_hdl].nblocks; i++) {
    SPA[new_hdl].blkidx[i] = SPA[hdl].blkidx[i];
    SPA[new_hdl].blksize[i] = SPA[hdl].blksize[i];
    SPA[new_hdl].offset[i] = SPA[hdl].offset[i];
  }
  if (local_sync_end) pnga_pgroup_sync(grp);
  return s_dup;
}